

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_nodes.cpp
# Opt level: O1

unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true> __thiscall
duckdb::SampleOptions::Deserialize(SampleOptions *this,Deserializer *deserializer)

{
  undefined1 uVar1;
  SampleMethod SVar2;
  int iVar3;
  int64_t seed_;
  SampleOptions *this_00;
  pointer pSVar4;
  string str;
  Value sample_size;
  char *local_90 [2];
  char local_80 [16];
  Value local_70;
  undefined4 extraout_var;
  
  (*deserializer->_vptr_Deserializer[2])(deserializer,100,"sample_size");
  (*deserializer->_vptr_Deserializer[6])(deserializer);
  Value::Deserialize(&local_70,deserializer);
  (*deserializer->_vptr_Deserializer[7])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  iVar3 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x65,"is_percentage");
  if ((char)iVar3 == '\0') {
    uVar1 = false;
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
  }
  else {
    iVar3 = (*deserializer->_vptr_Deserializer[0xc])(deserializer);
    uVar1 = (undefined1)iVar3;
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  (*deserializer->_vptr_Deserializer[2])(deserializer,0x66,"method");
  if (deserializer->deserialize_enum_from_string == true) {
    (*deserializer->_vptr_Deserializer[0x1a])(local_90,deserializer);
    SVar2 = EnumUtil::FromString<duckdb::SampleMethod>(local_90[0]);
    if (local_90[0] != local_80) {
      operator_delete(local_90[0]);
    }
  }
  else {
    iVar3 = (*deserializer->_vptr_Deserializer[0xf])(deserializer);
    SVar2 = (SampleMethod)iVar3;
  }
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  iVar3 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x67,"seed");
  if ((char)iVar3 == '\0') {
    seed_ = 0;
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
  }
  else {
    iVar3 = (*deserializer->_vptr_Deserializer[0x14])(deserializer);
    seed_ = CONCAT44(extraout_var,iVar3);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  this_00 = (SampleOptions *)operator_new(0x58);
  SampleOptions(this_00,seed_);
  *(SampleOptions **)&(this->sample_size).type_ = this_00;
  pSVar4 = unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true>::
           operator->((unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true>
                       *)this);
  Value::operator=(&pSVar4->sample_size,&local_70);
  pSVar4 = unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true>::
           operator->((unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true>
                       *)this);
  pSVar4->is_percentage = (bool)uVar1;
  pSVar4 = unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true>::
           operator->((unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true>
                       *)this);
  pSVar4->method = SVar2;
  Value::~Value(&local_70);
  return (unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>)
         (unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>)this;
}

Assistant:

unique_ptr<SampleOptions> SampleOptions::Deserialize(Deserializer &deserializer) {
	auto sample_size = deserializer.ReadProperty<Value>(100, "sample_size");
	auto is_percentage = deserializer.ReadPropertyWithDefault<bool>(101, "is_percentage");
	auto method = deserializer.ReadProperty<SampleMethod>(102, "method");
	auto seed = deserializer.ReadPropertyWithDefault<int64_t>(103, "seed");
	auto result = duckdb::unique_ptr<SampleOptions>(new SampleOptions(seed));
	result->sample_size = sample_size;
	result->is_percentage = is_percentage;
	result->method = method;
	return result;
}